

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1parse.c
# Opt level: O0

int asn1_get_tagged_int(uchar **p,uchar *end,int tag,int *val)

{
  bool bVar1;
  ulong local_40;
  size_t len;
  uint *puStack_30;
  int ret;
  int *val_local;
  uchar *puStack_20;
  int tag_local;
  uchar *end_local;
  uchar **p_local;
  
  len._4_4_ = 0xffffff92;
  puStack_30 = (uint *)val;
  val_local._4_4_ = tag;
  puStack_20 = end;
  end_local = (uchar *)p;
  p_local._4_4_ = mbedtls_asn1_get_tag(p,end,&local_40,tag);
  if (p_local._4_4_ == 0) {
    if (local_40 == 0) {
      p_local._4_4_ = -100;
    }
    else if ((**(byte **)end_local & 0x80) == 0) {
      while( true ) {
        bVar1 = false;
        if (local_40 != 0) {
          bVar1 = **(char **)end_local == '\0';
        }
        if (!bVar1) break;
        *(long *)end_local = *(long *)end_local + 1;
        local_40 = local_40 - 1;
      }
      if (local_40 < 5) {
        if ((local_40 == 4) && ((**(byte **)end_local & 0x80) != 0)) {
          p_local._4_4_ = -100;
        }
        else {
          *puStack_30 = 0;
          while (local_40 != 0) {
            *puStack_30 = *puStack_30 << 8 | (uint)**(byte **)end_local;
            *(long *)end_local = *(long *)end_local + 1;
            local_40 = local_40 - 1;
          }
          p_local._4_4_ = 0;
        }
      }
      else {
        p_local._4_4_ = -100;
      }
    }
    else {
      p_local._4_4_ = -100;
    }
  }
  return p_local._4_4_;
}

Assistant:

static int asn1_get_tagged_int(unsigned char **p,
                               const unsigned char *end,
                               int tag, int *val)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len;

    if ((ret = mbedtls_asn1_get_tag(p, end, &len, tag)) != 0) {
        return ret;
    }

    /*
     * len==0 is malformed (0 must be represented as 020100 for INTEGER,
     * or 0A0100 for ENUMERATED tags
     */
    if (len == 0) {
        return MBEDTLS_ERR_ASN1_INVALID_LENGTH;
    }
    /* This is a cryptography library. Reject negative integers. */
    if ((**p & 0x80) != 0) {
        return MBEDTLS_ERR_ASN1_INVALID_LENGTH;
    }

    /* Skip leading zeros. */
    while (len > 0 && **p == 0) {
        ++(*p);
        --len;
    }

    /* Reject integers that don't fit in an int. This code assumes that
     * the int type has no padding bit. */
    if (len > sizeof(int)) {
        return MBEDTLS_ERR_ASN1_INVALID_LENGTH;
    }
    if (len == sizeof(int) && (**p & 0x80) != 0) {
        return MBEDTLS_ERR_ASN1_INVALID_LENGTH;
    }

    *val = 0;
    while (len-- > 0) {
        *val = (*val << 8) | **p;
        (*p)++;
    }

    return 0;
}